

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O1

void update_joybutton(uint8_t button,_Bool state)

{
  KEYINPUT_t *pKVar1;
  uint16_t uVar2;
  ushort uVar4;
  undefined3 in_register_00000039;
  ushort uVar3;
  
  pKVar1 = get_keyinput();
  switch(CONCAT31(in_register_00000039,button)) {
  case 0:
    uVar4 = (ushort)!state;
    uVar3 = pKVar1->raw & 0xfffe;
    break;
  case 1:
    uVar2 = (pKVar1->raw & 0xfffd) + (ushort)!state * 2;
    goto LAB_0011cb6c;
  default:
    goto switchD_0011cab4_caseD_2;
  case 4:
  case 5:
    uVar2 = (pKVar1->raw & 0xfffb) + (ushort)!state * 4;
    goto LAB_0011cb6c;
  case 6:
    uVar2 = (pKVar1->raw & 0xfff7) + (ushort)!state * 8;
    goto LAB_0011cb6c;
  case 9:
    uVar4 = (ushort)!state << 9;
    uVar3 = pKVar1->raw & 0xfdff;
    break;
  case 10:
    uVar4 = (ushort)!state << 8;
    uVar3 = pKVar1->raw & 0xfeff;
    break;
  case 0xb:
    uVar4 = (ushort)!state << 6;
    uVar3 = pKVar1->raw & 0xffbf;
    break;
  case 0xc:
    uVar4 = (ushort)!state << 7;
    uVar3 = pKVar1->raw & 0xff7f;
    break;
  case 0xd:
    uVar4 = (ushort)!state << 5;
    uVar3 = pKVar1->raw & 0xffdf;
    break;
  case 0xe:
    uVar4 = (ushort)!state << 4;
    uVar3 = pKVar1->raw & 0xffef;
  }
  uVar2 = uVar3 | uVar4;
LAB_0011cb6c:
  pKVar1->raw = uVar2;
switchD_0011cab4_caseD_2:
  return;
}

Assistant:

void update_joybutton(byte button, bool state) {
    KEYINPUT_t* KEYINPUT = get_keyinput();
    switch (button) {
        case SDL_CONTROLLER_BUTTON_DPAD_UP:
            KEYINPUT->up = !state;
            break;
        case SDL_CONTROLLER_BUTTON_DPAD_DOWN:
            KEYINPUT->down = !state;
            break;
        case SDL_CONTROLLER_BUTTON_DPAD_LEFT:
            KEYINPUT->left = !state;
            break;
        case SDL_CONTROLLER_BUTTON_DPAD_RIGHT:
            KEYINPUT->right = !state;
            break;
        case SDL_CONTROLLER_BUTTON_A:
            KEYINPUT->a = !state;
            break;
        case SDL_CONTROLLER_BUTTON_B:
            KEYINPUT->b = !state;
            break;
        case SDL_CONTROLLER_BUTTON_START:
            KEYINPUT->start = !state;
            break;
        case SDL_CONTROLLER_BUTTON_GUIDE:
        case SDL_CONTROLLER_BUTTON_BACK:
            KEYINPUT->select = !state;
            break;
        case SDL_CONTROLLER_BUTTON_LEFTSHOULDER:
            KEYINPUT->l = !state;
            break;
        case SDL_CONTROLLER_BUTTON_RIGHTSHOULDER:
            KEYINPUT->r = !state;
            break;
        default:
            break;
    }
}